

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O1

aiMatrix4x4 * __thiscall
Assimp::XGLImporter::ReadTrafo(aiMatrix4x4 *__return_storage_ptr__,XGLImporter *this)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar5;
  float fVar6;
  float fVar7;
  aiVector3D aVar8;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_9c;
  undefined1 local_98 [32];
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  string local_50;
  
  bVar1 = ReadElementUpToClosing(this,"transform");
  if (bVar1) {
    local_68._0_16_ = ZEXT816(0);
    local_a4 = 1.0;
    local_9c = 0.0;
    local_78 = ZEXT816(0);
    local_a8 = 0.0;
    local_98._0_16_ = ZEXT816(0);
    local_ac = 0.0;
    do {
      GetElementName_abi_cxx11_(&local_50,this);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar2 == 0) {
        aVar8 = ReadVec3(this);
        local_ac = aVar8.z;
        local_98._8_4_ = extraout_XMM0_Dc_00;
        local_98._0_8_ = aVar8._0_8_;
        local_98._12_4_ = extraout_XMM0_Dd_00;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar2 == 0) {
          aVar8 = ReadVec3(this);
          local_a8 = aVar8.z;
          local_78._8_4_ = extraout_XMM0_Dc_01;
          local_78._0_8_ = aVar8._0_8_;
          local_78._12_4_ = extraout_XMM0_Dd_01;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar2 == 0) {
            aVar8 = ReadVec3(this);
            local_9c = aVar8.z;
            local_68._8_4_ = extraout_XMM0_Dc;
            local_68._0_8_ = aVar8._0_8_;
            local_68._12_4_ = extraout_XMM0_Dd;
          }
        }
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if ((iVar2 == 0) && (local_a4 = ReadFloat(this), local_a4 < 0.0)) {
        LogFunctions<Assimp::XGLImporter>::LogError((char *)0x55e8b6);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar1 = ReadElementUpToClosing(this,"transform");
    } while (bVar1);
  }
  else {
    local_a4 = 1.0;
    local_ac = 0.0;
    local_98._0_8_ = 0;
    local_a8 = 0.0;
    local_78._0_8_ = 0;
    local_9c = 0.0;
    local_68._0_8_ = 0;
  }
  __return_storage_ptr__->a1 = 1.0;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->a3 = 0.0;
  __return_storage_ptr__->a4 = 0.0;
  __return_storage_ptr__->b1 = 0.0;
  __return_storage_ptr__->b2 = 1.0;
  __return_storage_ptr__->b3 = 0.0;
  __return_storage_ptr__->b4 = 0.0;
  __return_storage_ptr__->c1 = 0.0;
  __return_storage_ptr__->c2 = 0.0;
  __return_storage_ptr__->c3 = 1.0;
  __return_storage_ptr__->c4 = 0.0;
  __return_storage_ptr__->d1 = 0.0;
  __return_storage_ptr__->d2 = 0.0;
  __return_storage_ptr__->d3 = 0.0;
  __return_storage_ptr__->d4 = 1.0;
  fVar3 = local_ac * local_ac +
          (float)local_98._0_4_ * (float)local_98._0_4_ +
          (float)local_98._4_4_ * (float)local_98._4_4_;
  if (0.0001 <= fVar3) {
    fVar6 = local_a8 * local_a8 +
            (float)local_78._0_4_ * (float)local_78._0_4_ +
            (float)local_78._4_4_ * (float)local_78._4_4_;
    if (0.0001 <= fVar6) {
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      fVar3 = 1.0 / fVar3;
      fVar7 = (float)local_98._0_4_ * fVar3;
      fVar4 = (float)local_98._4_4_ * fVar3;
      local_ac = local_ac * fVar3;
      if (fVar6 < 0.0) {
        fVar6 = sqrtf(fVar6);
      }
      else {
        fVar6 = SQRT(fVar6);
      }
      fVar6 = 1.0 / fVar6;
      fVar3 = (float)local_78._0_4_ * fVar6;
      fVar5 = (float)local_78._4_4_ * fVar6;
      local_a8 = local_a8 * fVar6;
      if (ABS(local_a8 * local_ac + fVar3 * fVar7 + fVar4 * fVar5) <= 0.0001) {
        __return_storage_ptr__->a1 = (fVar4 * local_a8 - fVar5 * local_ac) * local_a4;
        __return_storage_ptr__->b1 = (local_ac * fVar3 - local_a8 * fVar7) * local_a4;
        __return_storage_ptr__->c1 = (fVar7 * fVar5 - fVar3 * fVar4) * local_a4;
        __return_storage_ptr__->a2 = fVar3 * local_a4;
        __return_storage_ptr__->b2 = local_a4 * fVar5;
        __return_storage_ptr__->c2 = local_a8 * local_a4;
        __return_storage_ptr__->a3 = fVar7 * local_a4;
        __return_storage_ptr__->b3 = local_a4 * fVar4;
        __return_storage_ptr__->c3 = local_a4 * local_ac;
        __return_storage_ptr__->a4 = (float)local_68._0_4_;
        __return_storage_ptr__->b4 = (float)local_68._4_4_;
        __return_storage_ptr__->c4 = local_9c;
        return __return_storage_ptr__;
      }
    }
  }
  LogFunctions<Assimp::XGLImporter>::LogError((char *)0x55e9bc);
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 XGLImporter::ReadTrafo()
{
    aiVector3D forward, up, right, position;
    float scale = 1.0f;

    while (ReadElementUpToClosing("transform")) {
        const std::string& s = GetElementName();
        if (s == "forward") {
            forward = ReadVec3();
        }
        else if (s == "up") {
            up = ReadVec3();
        }
        else if (s == "position") {
            position = ReadVec3();
        }
        if (s == "scale") {
            scale = ReadFloat();
            if(scale < 0.f) {
                // this is wrong, but we can leave the value and pass it to the caller
                LogError("found negative scaling in <transform>, ignoring");
            }
        }
    }

    aiMatrix4x4 m;
    if(forward.SquareLength() < 1e-4 || up.SquareLength() < 1e-4) {
        LogError("A direction vector in <transform> is zero, ignoring trafo");
        return m;
    }

    forward.Normalize();
    up.Normalize();

    right = forward ^ up;
    if (std::fabs(up * forward) > 1e-4) {
        // this is definitely wrong - a degenerate coordinate space ruins everything
        // so substitute identity transform.
        LogError("<forward> and <up> vectors in <transform> are skewing, ignoring trafo");
        return m;
    }

    right *= scale;
    up *= scale;
    forward *= scale;

    m.a1 = right.x;
    m.b1 = right.y;
    m.c1 = right.z;

    m.a2 = up.x;
    m.b2 = up.y;
    m.c2 = up.z;

    m.a3 = forward.x;
    m.b3 = forward.y;
    m.c3 = forward.z;

    m.a4 = position.x;
    m.b4 = position.y;
    m.c4 = position.z;

    return m;
}